

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int *piVar5;
  CURLM *m;
  CURL *pCVar6;
  undefined8 uVar7;
  CURL **ppCVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  timeval tVar12;
  timeval newer;
  timeval older;
  int maxfd;
  int running;
  int msgs_left;
  long timeout;
  timeval interval;
  int filetime;
  fd_set exc;
  char buf [200];
  int local_238;
  int local_234;
  int local_230;
  undefined1 local_22c [4];
  __suseconds_t local_228;
  __time_t local_220;
  long local_218;
  timeval local_210;
  char *local_200;
  fd_set local_1f8;
  fd_set local_178;
  fd_set local_f8;
  
  iVar2 = 0;
  num_handles = 0;
  blacklist_num_sites = 0;
  __stream = fopen64(libtest_arg2,"rb");
  if (__stream == (FILE *)0x0) {
    m = (CURLM *)0x0;
  }
  else {
    local_200 = URL;
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      do {
        iVar3 = __isoc99_fscanf(__stream,"%d %s\n",&local_1f8,&local_f8);
        iVar2 = num_handles;
        if (iVar3 == 0) {
          iVar2 = __isoc99_fscanf(__stream,"blacklist_site %s\n",&local_f8);
          if (iVar2 == 0) break;
          pcVar4 = strdup((char *)&local_f8);
          iVar2 = blacklist_num_sites;
          site_blacklist[blacklist_num_sites] = pcVar4;
          piVar5 = &blacklist_num_sites;
        }
        else {
          lVar9 = (long)num_handles;
          urltime[lVar9] = (int)local_1f8.__fds_bits[0];
          pcVar4 = strdup((char *)&local_f8);
          urlstring[lVar9] = pcVar4;
          piVar5 = &num_handles;
        }
        *piVar5 = iVar2 + 1;
        iVar2 = feof(__stream);
      } while (iVar2 == 0);
    }
    fclose(__stream);
    m = (CURLM *)0x0;
    site_blacklist[blacklist_num_sites] = (char *)0x0;
    server_blacklist[0] = (char *)0x0;
    iVar2 = 0;
    if (0 < num_handles) {
      tv_test_start = tutil_tvnow();
      curl_global_init(3);
      m = (CURLM *)curl_multi_init();
      if (m == (CURLM *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                      ,0x98);
        iVar2 = 0x7b;
      }
      else {
        if (0 < num_handles) {
          ppCVar8 = handles;
          lVar9 = 0;
          do {
            pCVar6 = (CURL *)curl_easy_init();
            *ppCVar8 = pCVar6;
            lVar9 = lVar9 + 1;
            ppCVar8 = ppCVar8 + 1;
          } while (lVar9 < num_handles);
        }
        iVar3 = curl_multi_setopt(m,3,1);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar7 = curl_multi_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                        ,0x9c,iVar3,uVar7);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_multi_setopt(m,7,2);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar7 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                          ,0x9d,iVar3,uVar7);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            iVar3 = curl_multi_setopt(m,8,3);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar7 = curl_multi_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                            ,0x9e,iVar3,uVar7);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              iVar3 = curl_multi_setopt(m,0x7539,15000);
              uVar1 = _stderr;
              iVar2 = 0;
              if (iVar3 != 0) {
                uVar7 = curl_multi_strerror(iVar3);
                curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                              ,0x9f,iVar3,uVar7);
                iVar2 = iVar3;
              }
              if (iVar2 == 0) {
                iVar3 = curl_multi_setopt(m,0x753a,10000);
                uVar1 = _stderr;
                iVar2 = 0;
                if (iVar3 != 0) {
                  uVar7 = curl_multi_strerror(iVar3);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                ,0xa0,iVar3,uVar7);
                  iVar2 = iVar3;
                }
                if (iVar2 == 0) {
                  iVar3 = curl_multi_setopt(m,0x271b,site_blacklist);
                  uVar1 = _stderr;
                  iVar2 = 0;
                  if (iVar3 != 0) {
                    uVar7 = curl_multi_strerror(iVar3);
                    curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                  ,0xa2,iVar3,uVar7);
                    iVar2 = iVar3;
                  }
                  if (iVar2 == 0) {
                    iVar3 = curl_multi_setopt(m,0x271c,server_blacklist);
                    uVar1 = _stderr;
                    iVar2 = 0;
                    if (iVar3 != 0) {
                      uVar7 = curl_multi_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                    ,0xa3,iVar3,uVar7);
                      iVar2 = iVar3;
                    }
                    if (iVar2 == 0) {
                      tVar12 = tutil_tvnow();
                      local_238 = 0;
                      iVar2 = 0;
                      do {
                        local_228 = tVar12.tv_usec;
                        local_220 = tVar12.tv_sec;
                        local_234 = -99;
                        local_210.tv_sec = 1;
                        local_210.tv_usec = 0;
                        if (local_238 < num_handles) {
                          newer = tutil_tvnow();
                          older.tv_usec = local_228;
                          older.tv_sec = local_220;
                          lVar9 = tutil_tvdiff(newer,older);
                          tVar12.tv_usec = local_228;
                          tVar12.tv_sec = local_220;
                          if (urltime[local_238] <= lVar9) {
                            curl_mfprintf(_stdout,"Adding handle %d\n",local_238);
                            setup_handle(local_200,m,local_238);
                            local_238 = local_238 + 1;
                            tVar12 = newer;
                          }
                        }
                        local_228 = tVar12.tv_usec;
                        local_220 = tVar12.tv_sec;
                        curl_multi_perform(m,&local_230);
                        tVar12 = tutil_tvnow();
                        lVar9 = tutil_tvdiff(tVar12,tv_test_start);
                        if (60000 < lVar9) {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                        ,0xbd);
                          iVar2 = 0x7d;
                        }
                        if (iVar2 == 0) {
                          while( true ) {
                            piVar5 = (int *)curl_multi_info_read(m,local_22c);
                            if (piVar5 == (int *)0x0) break;
                            if (*piVar5 == 1) {
                              if (num_handles < 1) {
                                uVar10 = 0;
                              }
                              else {
                                ppCVar8 = handles;
                                uVar10 = 0;
                                do {
                                  if (*(CURL **)(piVar5 + 2) == *ppCVar8) goto LAB_001028a6;
                                  uVar10 = uVar10 + 1;
                                  ppCVar8 = ppCVar8 + 1;
                                } while ((uint)num_handles != uVar10);
                                uVar10 = (ulong)(uint)num_handles;
                              }
LAB_001028a6:
                              curl_mprintf("Handle %d Completed with status %d\n",
                                           uVar10 & 0xffffffff,piVar5[4]);
                              curl_multi_remove_handle(m,handles[uVar10 & 0xffffffff]);
                            }
                          }
                          if ((local_238 == num_handles) && (local_230 == 0)) {
                            iVar3 = 0x25;
                          }
                          else {
                            local_f8.__fds_bits[0xe] = 0;
                            local_f8.__fds_bits[0xf] = 0;
                            local_f8.__fds_bits[0xc] = 0;
                            local_f8.__fds_bits[0xd] = 0;
                            local_f8.__fds_bits[10] = 0;
                            local_f8.__fds_bits[0xb] = 0;
                            local_f8.__fds_bits[8] = 0;
                            local_f8.__fds_bits[9] = 0;
                            local_f8.__fds_bits[6] = 0;
                            local_f8.__fds_bits[7] = 0;
                            local_f8.__fds_bits[4] = 0;
                            local_f8.__fds_bits[5] = 0;
                            local_f8.__fds_bits[2] = 0;
                            local_f8.__fds_bits[3] = 0;
                            local_f8.__fds_bits[0] = 0;
                            local_f8.__fds_bits[1] = 0;
                            local_1f8.__fds_bits[0] = 0;
                            local_1f8.__fds_bits[1] = 0;
                            local_1f8.__fds_bits[2] = 0;
                            local_1f8.__fds_bits[3] = 0;
                            local_1f8.__fds_bits[4] = 0;
                            local_1f8.__fds_bits[5] = 0;
                            local_1f8.__fds_bits[6] = 0;
                            local_1f8.__fds_bits[7] = 0;
                            local_1f8.__fds_bits[8] = 0;
                            local_1f8.__fds_bits[9] = 0;
                            local_1f8.__fds_bits[10] = 0;
                            local_1f8.__fds_bits[0xb] = 0;
                            local_1f8.__fds_bits[0xc] = 0;
                            local_1f8.__fds_bits[0xd] = 0;
                            local_1f8.__fds_bits[0xe] = 0;
                            local_1f8.__fds_bits[0xf] = 0;
                            local_178.__fds_bits[0] = 0;
                            local_178.__fds_bits[1] = 0;
                            local_178.__fds_bits[2] = 0;
                            local_178.__fds_bits[3] = 0;
                            local_178.__fds_bits[4] = 0;
                            local_178.__fds_bits[5] = 0;
                            local_178.__fds_bits[6] = 0;
                            local_178.__fds_bits[7] = 0;
                            local_178.__fds_bits[8] = 0;
                            local_178.__fds_bits[9] = 0;
                            local_178.__fds_bits[10] = 0;
                            local_178.__fds_bits[0xb] = 0;
                            local_178.__fds_bits[0xc] = 0;
                            local_178.__fds_bits[0xd] = 0;
                            local_178.__fds_bits[0xe] = 0;
                            local_178.__fds_bits[0xf] = 0;
                            curl_multi_fdset(m,&local_f8,&local_1f8,&local_178,&local_234);
                            curl_multi_timeout(m,&local_218);
                            if (local_218 < 0) {
                              local_218 = 1;
                            }
                            local_210.tv_sec = 0;
                            local_210.tv_usec = 1000;
                            iVar3 = select_wrapper(local_234 + 1,&local_f8,&local_1f8,&local_178,
                                                   &local_210);
                            if (iVar3 == -1) {
                              piVar5 = __errno_location();
                              uVar1 = _stderr;
                              iVar2 = *piVar5;
                              pcVar4 = strerror(iVar2);
                              curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                            ,0xe8,iVar2,pcVar4);
                              iVar2 = 0x79;
                            }
                            if (iVar2 != 0) goto LAB_0010286f;
                            tVar12 = tutil_tvnow();
                            lVar9 = tutil_tvdiff(tVar12,tv_test_start);
                            iVar3 = 0;
                            iVar2 = 0;
                            if (60000 < lVar9) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                            ,0xea);
                              iVar2 = 0x7d;
                              iVar3 = 2;
                            }
                          }
                        }
                        else {
LAB_0010286f:
                          iVar3 = 2;
                        }
                        tVar12.tv_usec = local_228;
                        tVar12.tv_sec = local_220;
                      } while (iVar3 == 0);
                      if ((iVar3 != 2) && (iVar3 != 0x25)) goto LAB_00102b9c;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (0 < num_handles) {
    ppCVar8 = handles;
    lVar9 = 0;
    do {
      if (*ppCVar8 != (CURL *)0x0) {
        curl_easy_cleanup();
      }
      lVar9 = lVar9 + 1;
      ppCVar8 = ppCVar8 + 1;
    } while (lVar9 < num_handles);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();
  lVar9 = (long)num_handles;
  if (0 < lVar9) {
    lVar11 = 0;
    do {
      free(*(void **)((long)urlstring + lVar11));
      *(undefined8 *)((long)urlstring + lVar11) = 0;
      lVar11 = lVar11 + 8;
    } while (lVar9 * 8 != lVar11);
  }
  lVar9 = (long)blacklist_num_sites;
  if (0 < lVar9) {
    lVar11 = 0;
    do {
      free(*(void **)((long)site_blacklist + lVar11));
      *(undefined8 *)((long)site_blacklist + lVar11) = 0;
      lVar11 = lVar11 + 8;
    } while (lVar9 * 8 != lVar11);
  }
LAB_00102b9c:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int running;
  int handlenum = 0;
  struct timeval last_handle_add;

  if(parse_url_file(libtest_arg2) <= 0)
    goto test_cleanup;

  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  create_handles();

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);
  multi_setopt(m, CURLMOPT_MAX_HOST_CONNECTIONS, 2L);
  multi_setopt(m, CURLMOPT_MAX_PIPELINE_LENGTH, 3L);
  multi_setopt(m, CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE, 15000L);
  multi_setopt(m, CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE, 10000L);

  multi_setopt(m, CURLMOPT_PIPELINING_SITE_BL, site_blacklist);
  multi_setopt(m, CURLMOPT_PIPELINING_SERVER_BL, server_blacklist);

  last_handle_add = tutil_tvnow();

  for(;;) {
    struct timeval interval;
    struct timeval now;
    fd_set rd, wr, exc;
    int maxfd = -99;
    long timeout;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    if(handlenum < num_handles) {
      now = tutil_tvnow();
      if(tutil_tvdiff(now, last_handle_add) >= urltime[handlenum]) {
        fprintf(stdout, "Adding handle %d\n", handlenum);
        setup_handle(URL, m, handlenum);
        last_handle_add = now;
        handlenum++;
      }
    }

    curl_multi_perform(m, &running);

    abort_on_test_timeout();

    /* See how the transfers went */
    do {
      msg = curl_multi_info_read(m, &msgs_left);
      if(msg && msg->msg == CURLMSG_DONE) {
        int i, found = 0;

        /* Find out which handle this message is about */
        for(i = 0; i < num_handles; i++) {
          found = (msg->easy_handle == handles[i]);
          if(found)
            break;
        }

        printf("Handle %d Completed with status %d\n", i, msg->data.result);
        curl_multi_remove_handle(m, handles[i]);
      }
    } while(msg);

    if(handlenum == num_handles && !running) {
      break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    curl_multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    curl_multi_timeout(m, &timeout);

    if(timeout < 0)
      timeout = 1;

    interval.tv_sec = timeout / 1000;
    interval.tv_usec = (timeout % 1000) * 1000;

    interval.tv_sec = 0;
    interval.tv_usec = 1000;

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  remove_handles();

  /* undocumented cleanup sequence - type UB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  free_urls();
  return res;
}